

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O0

Index __thiscall wasm::DataFlow::Users::getNumUses(Users *this,Node *node)

{
  Node *pNVar1;
  bool bVar2;
  bool bVar3;
  UserSet *this_00;
  reference ppNVar4;
  reference ppNVar5;
  Node *value;
  iterator __end3;
  iterator __begin3;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *__range3;
  bool found;
  Node *user;
  iterator __end2;
  iterator __begin2;
  UserSet *__range2;
  Index numUses;
  UserSet *users;
  Node *node_local;
  Users *this_local;
  
  this_00 = getUsers(this,node);
  __range2._4_4_ = 0;
  __end2 = std::
           unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
           ::begin(this_00);
  user = (Node *)std::
                 unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                 ::end(this_00);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>,
                       (_Node_iterator_base<wasm::DataFlow::Node_*,_false> *)&user);
    if (!bVar2) {
      return __range2._4_4_;
    }
    ppNVar4 = std::__detail::_Node_iterator<wasm::DataFlow::Node_*,_true,_false>::operator*(&__end2)
    ;
    pNVar1 = *ppNVar4;
    bVar2 = false;
    __end3 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::begin
                       (&pNVar1->values);
    value = (Node *)std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                    end(&pNVar1->values);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                                  *)&value);
      if (!bVar3) break;
      ppNVar5 = __gnu_cxx::
                __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                ::operator*(&__end3);
      if (*ppNVar5 == node) {
        __range2._4_4_ = __range2._4_4_ + 1;
        bVar2 = true;
      }
      __gnu_cxx::
      __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
      ::operator++(&__end3);
    }
    if (!bVar2) break;
    std::__detail::_Node_iterator<wasm::DataFlow::Node_*,_true,_false>::operator++(&__end2);
  }
  __assert_fail("found",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/users.h"
                ,0x4b,"Index wasm::DataFlow::Users::getNumUses(Node *)");
}

Assistant:

Index getNumUses(Node* node) {
    auto& users = getUsers(node);
    // A user may have more than one use
    Index numUses = 0;
    for (auto* user : users) {
#ifndef NDEBUG
      bool found = false;
#endif
      for (auto* value : user->values) {
        if (value == node) {
          numUses++;
#ifndef NDEBUG
          found = true;
#endif
        }
      }
      assert(found);
    }
    return numUses;
  }